

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

void __thiscall
HighsSymmetryDetection::cleanupBacktrack(HighsSymmetryDetection *this,HighsInt cellCreationStackPos)

{
  int pos;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  HighsInt HVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  iVar10 = (int)((ulong)((long)(this->cellCreationStack).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->cellCreationStack).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  do {
    do {
      iVar10 = iVar10 + -1;
      if (iVar10 < cellCreationStackPos) {
        std::vector<int,_std::allocator<int>_>::resize
                  (&this->cellCreationStack,(long)cellCreationStackPos);
        return;
      }
      pos = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar10];
      HVar7 = getCellStart(this,pos);
      piVar4 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar4[HVar7];
    } while (iVar1 <= pos);
    lVar8 = (long)pos;
    piVar5 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      iVar2 = piVar6[lVar8 + lVar9];
      iVar3 = piVar5[iVar2];
      if (iVar3 != pos) break;
      if ((iVar3 != HVar7) && (piVar5[iVar2] = HVar7, HVar7 - lVar8 != lVar9)) {
        piVar4[lVar8 + lVar9] = HVar7;
      }
      lVar9 = lVar9 + 1;
    } while (iVar1 - pos != (int)lVar9);
  } while( true );
}

Assistant:

void HighsSymmetryDetection::cleanupBacktrack(HighsInt cellCreationStackPos) {
  // the links have been updated. Even though they might still not be fully
  // compressed the cell starts will all point to the correct cell end and the
  // lookup with path compression will give the correct start
  for (HighsInt stackPos = cellCreationStack.size() - 1;
       stackPos >= cellCreationStackPos; --stackPos) {
    HighsInt cell = cellCreationStack[stackPos];

    HighsInt cellStart = getCellStart(cell);
    HighsInt cellEnd = currentPartitionLinks[cellStart];

    for (HighsInt v = cell;
         v < cellEnd && vertexToCell[currentPartition[v]] == cell; ++v)
      updateCellMembership(v, cellStart, false);
  }

  cellCreationStack.resize(cellCreationStackPos);
}